

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O3

Status __thiscall
sentencepiece::SentencePieceProcessor::Load(SentencePieceProcessor *this,ModelProto *model_proto)

{
  tuple<sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_> this_00;
  ModelProto *in_RDX;
  __single_object model_proto_copy;
  __uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
  local_30;
  unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_> local_28;
  
  this_00.
  super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
  .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
        )operator_new(0x68);
  ModelProto::ModelProto
            ((ModelProto *)
             this_00.
             super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
             .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl,(Arena *)0x0);
  local_30._M_t.
  super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
  .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl =
       (tuple<sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>)
       (tuple<sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>)
       this_00.
       super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
       .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl;
  ModelProto::CopyFrom
            ((ModelProto *)
             this_00.
             super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
             .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl,in_RDX);
  local_30._M_t.
  super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
  .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl =
       (tuple<sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>)
       (_Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
        )0x0;
  local_28._M_t.
  super___uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>.
  _M_t.
  super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
  .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl =
       (__uniq_ptr_data<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>,_true,_true>
        )(__uniq_ptr_data<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>,_true,_true>
          )this_00.
           super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
           .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl;
  (*(model_proto->super_MessageLite)._vptr_MessageLite[5])(this,model_proto);
  std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
  ~unique_ptr(&local_28);
  std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
  ~unique_ptr((unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
               *)&local_30);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::Load(const ModelProto &model_proto) {
  auto model_proto_copy = std::make_unique<ModelProto>();
  *model_proto_copy = model_proto;
  return Load(std::move(model_proto_copy));
}